

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O2

MOJOSHADER_irExpression *
build_ir_logical_and_or(Context_conflict *ctx,MOJOSHADER_astExpressionBinary *ast,int left_testval)

{
  int iffalse;
  int iftrue;
  int index;
  MOJOSHADER_astExpression *_ast;
  MOJOSHADER_irExpression *pMVar1;
  MOJOSHADER_irExpression *pMVar2;
  MOJOSHADER_irStatement *pMVar3;
  MOJOSHADER_irStatement *pMVar4;
  MOJOSHADER_irStatement *pMVar5;
  MOJOSHADER_irStatement *pMVar6;
  MOJOSHADER_irStatement *pMVar7;
  MOJOSHADER_irStatement *pMVar8;
  MOJOSHADER_irStatement *pMVar9;
  MOJOSHADER_irStatement *pMVar10;
  MOJOSHADER_irStatement *next;
  int writemask;
  int writemask_00;
  
  _ast = ast->left;
  if (_ast->datatype->type != MOJOSHADER_AST_DATATYPE_BOOL) {
    __assert_fail("ast->left->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                  ,0x1313,
                  "MOJOSHADER_irExpression *build_ir_logical_and_or(Context *, const MOJOSHADER_astExpressionBinary *, const int)"
                 );
  }
  if (ast->right->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL) {
    iftrue = ctx->ir_label_count;
    index = ctx->ir_temp_count;
    iffalse = iftrue + 1;
    ctx->ir_label_count = iftrue + 4;
    ctx->ir_temp_count = index + 1;
    pMVar1 = build_ir_expr(ctx,_ast);
    pMVar2 = new_ir_constbool(ctx,left_testval);
    pMVar3 = new_ir_cjump(ctx,MOJOSHADER_IR_COND_EQL,pMVar1,pMVar2,iftrue + 2,iffalse);
    pMVar4 = new_ir_label(ctx,iftrue + 2);
    pMVar1 = build_ir_expr(ctx,ast->right);
    writemask_00 = 1;
    pMVar2 = new_ir_constbool(ctx,1);
    pMVar5 = new_ir_cjump(ctx,MOJOSHADER_IR_COND_EQL,pMVar1,pMVar2,iftrue,iffalse);
    pMVar6 = new_ir_label(ctx,iftrue);
    writemask = writemask_00;
    pMVar1 = new_ir_temp(ctx,index,MOJOSHADER_AST_DATATYPE_BOOL,1);
    pMVar2 = new_ir_constbool(ctx,1);
    pMVar7 = new_ir_move(ctx,pMVar1,pMVar2,writemask);
    pMVar8 = new_ir_jump(ctx,iftrue + 3);
    pMVar9 = new_ir_label(ctx,iffalse);
    pMVar1 = new_ir_temp(ctx,index,MOJOSHADER_AST_DATATYPE_BOOL,1);
    pMVar2 = new_ir_constbool(ctx,0);
    pMVar10 = new_ir_move(ctx,pMVar1,pMVar2,writemask_00);
    next = new_ir_label(ctx,iftrue + 3);
    pMVar10 = new_ir_seq(ctx,pMVar10,next);
    pMVar9 = new_ir_seq(ctx,pMVar9,pMVar10);
    pMVar8 = new_ir_seq(ctx,pMVar8,pMVar9);
    pMVar7 = new_ir_seq(ctx,pMVar7,pMVar8);
    pMVar6 = new_ir_seq(ctx,pMVar6,pMVar7);
    pMVar5 = new_ir_seq(ctx,pMVar5,pMVar6);
    pMVar4 = new_ir_seq(ctx,pMVar4,pMVar5);
    pMVar3 = new_ir_seq(ctx,pMVar3,pMVar4);
    pMVar1 = new_ir_temp(ctx,index,MOJOSHADER_AST_DATATYPE_BOOL,1);
    pMVar1 = new_ir_eseq(ctx,pMVar3,pMVar1);
    return pMVar1;
  }
  __assert_fail("ast->right->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                ,0x1314,
                "MOJOSHADER_irExpression *build_ir_logical_and_or(Context *, const MOJOSHADER_astExpressionBinary *, const int)"
               );
}

Assistant:

static MOJOSHADER_irExpression *build_ir_logical_and_or(Context *ctx,
                                    const MOJOSHADER_astExpressionBinary *ast,
                                    const int left_testval)
{
    /* The gist...
            cjump left == left_testval, maybe, f
        maybe:
            cjump right == true, t, f
        t:
            move tmp, 1
            jump join
        f:
            move tmp, 0
        join:
    */

    assert(ast->left->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL);
    assert(ast->right->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL);

    const int t = generate_ir_label(ctx);
    const int f = generate_ir_label(ctx);
    const int maybe = generate_ir_label(ctx);
    const int join = generate_ir_label(ctx);
    const int tmp = generate_ir_temp(ctx);

    return new_ir_eseq(ctx,
                new_ir_seq(ctx, new_ir_cjump(ctx, MOJOSHADER_IR_COND_EQL, build_ir_expr(ctx, ast->left), new_ir_constbool(ctx, left_testval), maybe, f),
                new_ir_seq(ctx, new_ir_label(ctx, maybe),
                new_ir_seq(ctx, new_ir_cjump(ctx, MOJOSHADER_IR_COND_EQL, build_ir_expr(ctx, ast->right), new_ir_constbool(ctx, 1), t, f),
                new_ir_seq(ctx, new_ir_label(ctx, t),
                new_ir_seq(ctx, new_ir_move(ctx, new_ir_temp(ctx, tmp, MOJOSHADER_AST_DATATYPE_BOOL, 1), new_ir_constbool(ctx, 1), -1),
                new_ir_seq(ctx, new_ir_jump(ctx, join),
                new_ir_seq(ctx, new_ir_label(ctx, f),
                new_ir_seq(ctx, new_ir_move(ctx, new_ir_temp(ctx, tmp, MOJOSHADER_AST_DATATYPE_BOOL, 1), new_ir_constbool(ctx, 0), -1),
                                new_ir_label(ctx, join))))))))),
                    new_ir_temp(ctx, tmp, MOJOSHADER_AST_DATATYPE_BOOL, 1));
}